

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueMatrixCase::test(UniformValueMatrixCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  RenderContext *renderCtx;
  TestContext *pTVar2;
  deUint32 dVar3;
  bool bVar4;
  GLint GVar5;
  MessageBuilder *pMVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  GLfloat *params;
  int iVar10;
  GLfloat *local_3b0;
  allocator<char> local_392;
  allocator<char> local_391;
  ApiCase *local_390;
  float matrixValues [16];
  StateQueryMemoryWriteGuard<float[4]> state;
  GLfloat local_300 [32];
  ShaderProgram program;
  undefined1 local_1b0 [384];
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state,
             "uniform highp mat2 mat2Uniform;uniform highp mat3 mat3Uniform;uniform highp mat4 mat4Uniform;void main (void)\n{\n\tgl_Position = vec4(mat2Uniform[0][0] + mat3Uniform[0][0] + mat4Uniform[0][0]);\n}\n"
             ,&local_391);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)matrixValues,"void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n",
             &local_392);
  glu::makeVtxFragSources((ProgramSources *)local_1b0,(string *)&state,(string *)matrixValues);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_1b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
  std::__cxx11::string::~string((string *)matrixValues);
  std::__cxx11::string::~string((string *)&state);
  if (program.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&program);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,program.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    matrixValues[0xc] = 41.0;
    matrixValues[0xd] = 65.0;
    matrixValues[0xe] = 4.0;
    matrixValues[0xf] = 12.2;
    matrixValues[8] = -55.1;
    matrixValues[9] = 1.1;
    matrixValues[10] = 98.0;
    matrixValues[0xb] = 19.0;
    matrixValues[4] = 13.0;
    matrixValues[5] = 55.0;
    matrixValues[6] = 12.0;
    matrixValues[7] = 91.0;
    matrixValues[0] = -1.0;
    matrixValues[1] = 0.1;
    matrixValues[2] = 4.0;
    matrixValues[3] = 800.0;
    local_390 = &this->super_ApiCase;
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"mat2Uniform");
    local_3b0 = matrixValues;
    glu::CallLogWrapper::glUniformMatrix2fv(this_00,GVar5,1,'\0',local_3b0);
    dVar3 = program.m_program.m_program;
    pTVar2 = (((ApiCase *)&local_390->super_TestCase)->super_TestCase).super_TestCase.super_TestNode
             .m_testCtx;
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
              (&state);
    pfVar9 = state.m_value;
    glu::CallLogWrapper::glGetUniformfv(this_00,dVar3,GVar5,pfVar9);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                      (&state,pTVar2);
    if (bVar4) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        iVar10 = 0;
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 4) {
          if ((*(float *)((long)local_3b0 + lVar8) != *(float *)((long)pfVar9 + lVar8)) ||
             (NAN(*(float *)((long)local_3b0 + lVar8)) || NAN(*(float *)((long)pfVar9 + lVar8)))) {
            local_1b0._0_8_ = pTVar2->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"// ERROR: at index [");
            std::ostream::operator<<(poVar1,(int)lVar7);
            std::operator<<((ostream *)poVar1,"][");
            std::ostream::operator<<(poVar1,iVar10);
            std::operator<<((ostream *)poVar1,"] expected ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b0,(float *)((long)local_3b0 + lVar8));
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            "; got ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(lVar8 + (long)pfVar9));
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (pTVar2,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
            }
          }
          iVar10 = iVar10 + 1;
        }
        local_3b0 = local_3b0 + 2;
        pfVar9 = pfVar9 + 2;
      }
    }
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"mat3Uniform");
    local_3b0 = matrixValues;
    glu::CallLogWrapper::glUniformMatrix3fv(this_00,GVar5,1,'\0',local_3b0);
    dVar3 = program.m_program.m_program;
    pTVar2 = (((ApiCase *)&local_390->super_TestCase)->super_TestCase).super_TestCase.super_TestNode
             .m_testCtx;
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float[9]> *)&state);
    pfVar9 = state.m_postguard + 1;
    glu::CallLogWrapper::glGetUniformfv(this_00,dVar3,GVar5,pfVar9);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float[9]> *)&state,pTVar2);
    if (bVar4) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        iVar10 = 0;
        for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
          if ((*(float *)((long)local_3b0 + lVar8) != *(float *)((long)pfVar9 + lVar8)) ||
             (NAN(*(float *)((long)local_3b0 + lVar8)) || NAN(*(float *)((long)pfVar9 + lVar8)))) {
            local_1b0._0_8_ = pTVar2->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"// ERROR: at index [");
            std::ostream::operator<<(poVar1,(int)lVar7);
            std::operator<<((ostream *)poVar1,"][");
            std::ostream::operator<<(poVar1,iVar10);
            std::operator<<((ostream *)poVar1,"] expected ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b0,(float *)((long)local_3b0 + lVar8));
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            "; got ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(lVar8 + (long)pfVar9));
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (pTVar2,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
            }
          }
          iVar10 = iVar10 + 1;
        }
        pfVar9 = pfVar9 + 3;
        local_3b0 = local_3b0 + 3;
      }
    }
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"mat4Uniform");
    local_3b0 = matrixValues;
    glu::CallLogWrapper::glUniformMatrix4fv(this_00,GVar5,1,'\0',local_3b0);
    pTVar2 = (((ApiCase *)&local_390->super_TestCase)->super_TestCase).super_TestCase.super_TestNode
             .m_testCtx;
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float[16]> *)&state);
    params = local_300;
    glu::CallLogWrapper::glGetUniformfv(this_00,program.m_program.m_program,GVar5,params);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float[16]> *)&state,pTVar2);
    if (bVar4) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        iVar10 = 0;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
          if ((*(float *)((long)local_3b0 + lVar8) != *(float *)((long)params + lVar8)) ||
             (NAN(*(float *)((long)local_3b0 + lVar8)) || NAN(*(float *)((long)params + lVar8)))) {
            local_1b0._0_8_ = pTVar2->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"// ERROR: at index [");
            std::ostream::operator<<(poVar1,(int)lVar7);
            std::operator<<((ostream *)poVar1,"][");
            std::ostream::operator<<(poVar1,iVar10);
            std::operator<<((ostream *)poVar1,"] expected ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b0,(float *)((long)local_3b0 + lVar8));
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            "; got ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(lVar8 + (long)params));
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (pTVar2,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
            }
          }
          iVar10 = iVar10 + 1;
        }
        local_3b0 = local_3b0 + 4;
        params = params + 4;
      }
    }
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(local_390,0);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp mat2 mat2Uniform;"
			"uniform highp mat3 mat3Uniform;"
			"uniform highp mat4 mat4Uniform;"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(mat2Uniform[0][0] + mat3Uniform[0][0] + mat4Uniform[0][0]);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		float matrixValues[4 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
		};

		// the values of the matrix are returned in column major order but they can be given in either order

		location = glGetUniformLocation(program.getProgram(), "mat2Uniform");
		glUniformMatrix2fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<2>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		location = glGetUniformLocation(program.getProgram(), "mat3Uniform");
		glUniformMatrix3fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<3>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		location = glGetUniformLocation(program.getProgram(), "mat4Uniform");
		glUniformMatrix4fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<4>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}